

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O2

void __thiscall spdlog::details::file_helper::~file_helper(file_helper *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  file_event_handlers::~file_event_handlers(&this->event_handlers_);
  std::__cxx11::string::~string((string *)&this->filename_);
  return;
}

Assistant:

SPDLOG_INLINE file_helper::~file_helper() { close(); }